

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::HasRootProperty
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,bool *noRedecl,bool *pDeclaredProperty,
          bool *pNonconfigurableProperty)

{
  byte bVar1;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  bool bVar2;
  uint uVar3;
  uint32 index;
  BOOL BVar4;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  
  if (propertyId != -1) {
    propertyRecord = (PropertyRecord *)pNonconfigurableProperty;
    local_40 = ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
    this_00 = (this->propertyMap).ptr;
    uVar3 = JsUtil::
            BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
            ::FindEntryWithKey<Js::PropertyRecord_const*>
                      ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                        *)this_00,&local_40);
    if ((int)uVar3 < 0) {
      bVar2 = DynamicObject::HasObjectArray(instance);
      BVar4 = 0;
      if ((bVar2) && (local_40->isNumeric == true)) {
        index = PropertyRecord::GetNumericValue(local_40);
        BVar4 = DynamicTypeHandler::HasItem(&this->super_DynamicTypeHandler,instance,index);
      }
    }
    else {
      bVar1 = *(PropertyAttributes *)
               ((long)&(this_00->entries).ptr[uVar3].
                       super_DictionaryEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
                       .
                       super_CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .
                       super_KeyValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
                       .
                       super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<int>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>_>
                       .
                       super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
                       .value + 1);
      BVar4 = 0;
      if ((bVar1 & 8) == 0) {
        if ((noRedecl != (bool *)0x0) && (0x3f < bVar1)) {
          *noRedecl = true;
        }
        if ((pDeclaredProperty != (bool *)0x0) && (0x1f < bVar1)) {
          *pDeclaredProperty = true;
        }
        BVar4 = 1;
        if ((propertyRecord != (PropertyRecord *)0x0) && ((bVar1 & 2) == 0)) {
          *(undefined1 *)
           &(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 1;
        }
      }
    }
    return BVar4;
  }
  return 0;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::HasProperty_Internal(DynamicObject* instance, PropertyId propertyId, bool *noRedecl, _Inout_opt_ PropertyValueInfo* info, bool *pDeclaredProperty, bool *pNonconfigurableProperty)
    {
        // HasProperty is called with NoProperty in JavascriptDispatch.cpp to for undeferral of the
        // deferred type system that DOM objects use.  Allow NoProperty for this reason, but only
        // here in HasProperty.
        if (propertyId == Constants::NoProperty)
        {
            return false;
        }

        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if ((descriptor->Attributes & PropertyDeleted) || (!allowLetConstGlobal && !descriptor->HasNonLetConstGlobal()))
            {
                return false;
            }
            if (noRedecl && descriptor->Attributes & PropertyNoRedecl)
            {
                *noRedecl = true;
            }
            if (pDeclaredProperty && descriptor->Attributes & (PropertyNoRedecl | PropertyDeclaredGlobal))
            {
                *pDeclaredProperty = true;
            }
            if (pNonconfigurableProperty && !(descriptor->Attributes & PropertyConfigurable))
            {
                *pNonconfigurableProperty = true;
            }
            if (info && descriptor->propertyIndex != NoSlots)
            {
                SetPropertyValueInfo(info, instance, descriptor);
            }
            return true;
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::HasItem(instance, propertyRecord->GetNumericValue());
        }

        return false;
    }